

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

void Abc_NtkSortCubes(Abc_Ntk_t *pNtk,int fWeight)

{
  Vec_Ptr_t *p;
  Vec_Str_t *p_00;
  Abc_Obj_t *pNode;
  int i;
  
  if (pNtk->ntkFunc == ABC_FUNC_SOP) {
    p = Vec_PtrAlloc(1000);
    p_00 = Vec_StrAlloc(1000);
    for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
      pNode = Abc_NtkObj(pNtk,i);
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        Abc_NodeSortCubes(pNode,p,p_00,fWeight);
      }
    }
    Vec_StrFree(p_00);
    Vec_PtrFree(p);
    return;
  }
  __assert_fail("Abc_NtkHasSop(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                ,499,"void Abc_NtkSortCubes(Abc_Ntk_t *, int)");
}

Assistant:

void Abc_NtkSortCubes( Abc_Ntk_t * pNtk, int fWeight )
{
    Vec_Ptr_t * vCubes;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkHasSop(pNtk) );
    vCubes = Vec_PtrAlloc( 1000 );
    vStore = Vec_StrAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pNode, i )
        Abc_NodeSortCubes( pNode, vCubes, vStore, fWeight );
    Vec_StrFree( vStore );
    Vec_PtrFree( vCubes );
}